

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O0

_Bool xdr_ncallhdr(XDR *xdrs,rpc_msg *cmsg)

{
  _Bool _Var1;
  uint uVar2;
  rpc_msg *cmsg_local;
  XDR *xdrs_local;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0xa5,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
  }
  if (cmsg != (rpc_msg *)0x0) {
    cmsg->rm_direction = CALL;
    (cmsg->ru).RM_cmb.cb_rpcvers = 2;
    if ((((xdrs->x_op == XDR_ENCODE) && (_Var1 = xdr_u_int32_t(xdrs,&cmsg->rm_xid), _Var1)) &&
        (uVar2 = xdr_enum((XDR *)xdrs,(enum_t *)&cmsg->rm_direction), (uVar2 & 1) != 0)) &&
       ((_Var1 = xdr_u_int32_t(xdrs,(u_int32_t *)&cmsg->ru), _Var1 &&
        (_Var1 = xdr_u_int32_t(xdrs,&cmsg->cb_prog), _Var1)))) {
      xdrs_local._7_1_ = xdr_u_int32_t(xdrs,&cmsg->cb_vers);
    }
    else {
      xdrs_local._7_1_ = false;
    }
    return xdrs_local._7_1_;
  }
  __assert_fail("cmsg != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                ,0xa6,"_Bool xdr_ncallhdr(XDR *, struct rpc_msg *)");
}

Assistant:

bool
xdr_ncallhdr(XDR *xdrs, struct rpc_msg *cmsg)
{
	assert(xdrs != NULL);
	assert(cmsg != NULL);

	cmsg->rm_direction = CALL;
	cmsg->rm_call.cb_rpcvers = RPC_MSG_VERSION;
	if ((xdrs->x_op == XDR_ENCODE)
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_xid))
	    && inline_xdr_enum(xdrs, (enum_t *) &(cmsg->rm_direction))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->rm_call.cb_rpcvers))
	    && inline_xdr_u_int32_t(xdrs, &(cmsg->cb_prog)))
		return (inline_xdr_u_int32_t(xdrs, &(cmsg->cb_vers)));
	return (false);
}